

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::Hook(Debugger *this,lua_Debug *ar,lua_State *L)

{
  pointer pfVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  iterator __begin3;
  pointer exec;
  shared_ptr<BreakPoint> bp;
  shared_ptr<HookState> state;
  undefined1 local_78 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  __shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->skipHook != false) {
    return;
  }
  this->currentL = L;
  iVar4 = getDebugEvent(ar);
  if (iVar4 != 2) {
    return;
  }
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_78,&this->luaThreadMtx)
  ;
  exec = (this->luaThreadExecutors).
         super__Vector_base<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pfVar1 = (this->luaThreadExecutors).
           super__Vector_base<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (exec != pfVar1) {
    for (; exec != pfVar1; exec = exec + 1) {
      ExecuteWithSkipHook(this,exec);
    }
    std::
    vector<std::function<void_(lua_State_*)>,_std::allocator<std::function<void_(lua_State_*)>_>_>::
    clear(&this->luaThreadExecutors);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
  FindBreakPoint((Debugger *)local_78,(lua_Debug *)this);
  if ((element_type *)local_78._0_8_ != (element_type *)0x0) {
    std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    bVar3 = ProcessBreakPoint(this,(shared_ptr<BreakPoint> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (bVar3) {
      HandleBreak(this);
      goto LAB_00155481;
    }
  }
  local_78._16_8_ = (lua_State *)0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::mutex::lock(&this->hookStateMtx);
  std::__shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2> *)(local_78 + 0x10),
             &(this->hookState).super___shared_ptr<HookState,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->hookStateMtx);
  uVar2 = local_78._16_8_;
  if ((lua_State *)local_78._16_8_ != (lua_State *)0x0) {
    std::__shared_ptr<Debugger,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Debugger,void>
              (local_50,(__weak_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2> *)this);
    (**(code **)&(*(GCObject **)uVar2)[1].tt)(uVar2,local_50,this->currentL,ar);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
LAB_00155481:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  return;
}

Assistant:

void Debugger::Hook(lua_Debug *ar, lua_State *L) {
	if (skipHook) {
		return;
	}
	// 设置当前协程
	SetCurrentState(L);

	if (getDebugEvent(ar) == LUA_HOOKLINE) {
		// 对luaTreadExecutors 执行加锁
		{
			std::unique_lock<std::mutex> lock(luaThreadMtx);
			if (!luaThreadExecutors.empty()) {
				for (auto &executor: luaThreadExecutors) {
					ExecuteWithSkipHook(executor);
				}
				luaThreadExecutors.clear();
			}
		}
		auto bp = FindBreakPoint(ar);
		if (bp && ProcessBreakPoint(bp)) {
			HandleBreak();
			return;
		}
		// 加锁

		std::shared_ptr<HookState> state = nullptr;

		{
			std::lock_guard<std::mutex> lock(hookStateMtx);
			state = hookState;
		}

		if (state) {
			state->ProcessHook(shared_from_this(), currentL, ar);
		}
	}
}